

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss_test.cc
# Opt level: O0

void __thiscall
xLearn::SQUARED_LOSS_Evalute_Test::~SQUARED_LOSS_Evalute_Test(SQUARED_LOSS_Evalute_Test *this)

{
  void *in_RDI;
  
  ~SQUARED_LOSS_Evalute_Test((SQUARED_LOSS_Evalute_Test *)0x185d68);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(SQUARED_LOSS, Evalute) {
  // Create pred vector
  std::vector<real_t> pred(kLine);
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = i;
  }
  // Create label vector
  std::vector<real_t> label(kLine);
  for (int i = 0; i < label.size(); ++i) {
    label[i] = 2*i;
  }
  // Create loss
  SquaredLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  loss.Evalute(pred, label);
  real_t val = loss.GetLoss();
  EXPECT_FLOAT_EQ(val, 14.25);
}